

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Abstract.h
# Opt level: O2

ostream * covenant::operator<<(ostream *o,AbstractMethod abs)

{
  string *this;
  char *pcVar1;
  allocator local_39;
  string local_38 [32];
  
  if (abs == SIGMA_STAR) {
    pcVar1 = "sigma-star";
  }
  else {
    if (abs != CYCLE_BREAKING) {
      this = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string(local_38,"invalid abstraction method",&local_39);
      std::__cxx11::string::string(this,local_38);
      __cxa_throw(this,&error::typeinfo,error::~error);
    }
    pcVar1 = "cycle-breaking";
  }
  std::operator<<(o,pcVar1);
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, AbstractMethod abs)
{
    if (abs == SIGMA_STAR)
      o << "sigma-star";
    else if (abs == CYCLE_BREAKING)
      o << "cycle-breaking";
    else throw error("invalid abstraction method");
    return o;
}